

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  byte bVar1;
  uint64_t uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  cTValue *pcVar7;
  char *pcVar8;
  size_t sVar9;
  byte *pbVar10;
  char *pcVar11;
  GCfunc *fn;
  uint uVar12;
  byte *pbVar13;
  int pathstrip;
  int size;
  char *name;
  uint local_70;
  int local_6c;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *local_38;
  
  local_5c = depth >> 0x1f | 1;
  uVar12 = 0xffffffff;
  if (depth < -1) {
    uVar12 = depth;
  }
  uVar12 = ~uVar12;
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  pathstrip = 1;
  local_70 = 0;
  local_68 = L;
  local_60 = depth;
  local_50 = (byte *)fmt;
  do {
    if (uVar12 == local_58) break;
    pcVar7 = lj_debug_frame(local_68,uVar12,&local_6c);
    if (pcVar7 != (cTValue *)0x0) {
      local_48 = pcVar7 + local_6c;
      if ((long)local_6c == 0) {
        local_48 = (cTValue *)0x0;
      }
      fn = (GCfunc *)(pcVar7[-1].u64 & 0x7fffffffffff);
      pbVar13 = local_50;
      iVar6 = pathstrip;
      local_54 = uVar12;
      local_40 = pcVar7;
LAB_001132bc:
      pathstrip = iVar6;
      bVar1 = *pbVar13;
      pbVar13 = pbVar13 + 1;
      if (bVar1 < 0x66) {
        if (bVar1 != 0x46) {
          if (bVar1 != 0x5a) {
            uVar12 = local_54;
            if (bVar1 != 0) goto LAB_0011344b;
            goto LAB_001134f3;
          }
          local_70 = *(int *)&sb->w - *(int *)&sb->b;
          iVar6 = pathstrip;
          goto LAB_001132bc;
        }
LAB_00113306:
        pcVar8 = lj_debug_funcname(local_68,local_40,&local_38);
        if (pcVar8 == (char *)0x0) goto LAB_0011338a;
        if (((bVar1 == 0x46) && ((fn->c).ffid == '\0')) &&
           (uVar2 = (fn->c).pc.ptr64, *(int *)(uVar2 - 0x20) != -1)) {
          debug_putchunkname(sb,(GCproto *)(uVar2 - 0x68),pathstrip);
          pcVar11 = sb->w;
          if (*(int *)&sb->e == (int)pcVar11) {
            pcVar11 = lj_buf_more2(sb,1);
          }
          *pcVar11 = ':';
          sb->w = pcVar11 + 1;
        }
        pcVar11 = local_38;
        sVar9 = strlen(local_38);
        lj_buf_putmem(sb,pcVar11,(MSize)sVar9);
        iVar6 = pathstrip;
        if (pcVar8 != (char *)0x0) goto LAB_001132bc;
      }
      else {
        iVar6 = 0;
        if (bVar1 == 0x70) goto LAB_001132bc;
        if (bVar1 != 0x6c) {
          if (bVar1 == 0x66) goto LAB_00113306;
LAB_0011344b:
          pbVar10 = (byte *)sb->w;
          if (*(int *)&sb->e == (int)pbVar10) {
            pbVar10 = (byte *)lj_buf_more2(sb,1);
          }
          *pbVar10 = bVar1;
          goto LAB_00113456;
        }
      }
LAB_0011338a:
      if ((fn->c).ffid == '\x01') {
        pcVar8 = sb->w;
        if (*(int *)&sb->e == (int)pcVar8) {
          pcVar8 = lj_buf_more2(sb,1);
        }
        *pcVar8 = '@';
        sb->w = pcVar8 + 1;
        lj_strfmt_putptr(sb,(fn->c).f);
        iVar6 = pathstrip;
        goto LAB_001132bc;
      }
      if ((fn->c).ffid == '\0') {
        lVar3 = *(long *)((long)fn + 0x20);
        iVar5 = debug_putchunkname(sb,(GCproto *)(lVar3 + -0x68),pathstrip);
        iVar6 = pathstrip;
        if (iVar5 != 0) {
          if (bVar1 == 0x6c) {
            iVar6 = debug_frameline(local_68,fn,local_48);
          }
          else {
            iVar6 = *(int *)(lVar3 + -0x20);
          }
          pcVar8 = sb->w;
          if (*(int *)&sb->e == (int)pcVar8) {
            pcVar8 = lj_buf_more2(sb,1);
          }
          *pcVar8 = ':';
          sb->w = pcVar8 + 1;
          if (iVar6 < 0) {
            iVar6 = *(int32_t *)(lVar3 + -0x20);
          }
          lj_strfmt_putint(sb,iVar6);
          iVar6 = pathstrip;
        }
        goto LAB_001132bc;
      }
      lj_buf_putmem(sb,"[builtin#",9);
      lj_strfmt_putint(sb,(uint)(fn->c).ffid);
      pbVar10 = (byte *)sb->w;
      if (*(int *)&sb->e == (int)pbVar10) {
        pbVar10 = (byte *)lj_buf_more2(sb,1);
      }
      *pbVar10 = 0x5d;
LAB_00113456:
      sb->w = (char *)(pbVar10 + 1);
      iVar6 = pathstrip;
      goto LAB_001132bc;
    }
    if (local_60 < 0) {
      uVar12 = uVar12 - local_6c;
LAB_001134f3:
      uVar12 = uVar12 + local_5c;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  } while (bVar4);
  if (local_70 != 0) {
    sb->w = sb->b + local_70;
  }
  return;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    sb->w = sb->b + lastlen;  /* Zap trailing separator. */
}